

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          MeshAttributeIndicesEncodingData *encoding_data)

{
  TraversalObserver traversal_observer;
  pointer connectivity;
  pointer sequencer;
  CornerTable *in_RDX;
  PointsSequencer *in_RSI;
  PointsSequencer *in_RDI;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  att_traverser;
  AttObserver att_observer;
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  traversal_sequencer;
  Mesh *mesh;
  pointer in_stack_fffffffffffffe88;
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_stack_fffffffffffffe90;
  MeshAttributeIndicesEncodingData *in_stack_fffffffffffffea0;
  Mesh *in_stack_fffffffffffffea8;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  *in_stack_fffffffffffffeb0;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *this_00;
  Mesh *mesh_00;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> _Var1;
  MeshAttributeIndicesEncodingObserver<draco::CornerTable> local_58;
  Mesh *local_20;
  CornerTable *local_18;
  
  _Var1._M_head_impl = in_RDI;
  local_18 = in_RDX;
  local_20 = MeshDecoder::mesh((MeshDecoder *)in_RSI->out_point_ids_);
  operator_new(0xc0);
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::MeshTraversalSequencer
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  this_00 = (TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             *)&stack0xffffffffffffffd8;
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>>
  ::
  unique_ptr<std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>,void>
            ((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
              *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  connectivity = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
                           ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                             *)in_stack_fffffffffffffe90);
  mesh_00 = local_20;
  sequencer = std::
              unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
              ::get((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                     *)in_stack_fffffffffffffe90);
  MeshAttributeIndicesEncodingObserver<draco::CornerTable>::MeshAttributeIndicesEncodingObserver
            (&local_58,connectivity,mesh_00,&sequencer->super_PointsSequencer,
             (MeshAttributeIndicesEncodingData *)local_18);
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::DepthFirstTraverser(in_stack_fffffffffffffe90);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             in_stack_fffffffffffffe90);
  traversal_observer.encoding_data_ = (MeshAttributeIndicesEncodingData *)in_RDI;
  traversal_observer.att_connectivity_ = (CornerTable *)mesh_00;
  traversal_observer.mesh_ = (Mesh *)_Var1._M_head_impl;
  traversal_observer.sequencer_ = in_RSI;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::Init(this_00,(CornerTable *)in_stack_fffffffffffffea8,traversal_observer);
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                *)0x161b55);
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::SetTraverser((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
                  *)local_58.encoding_data_,
                 (DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  *)local_58.att_connectivity_);
  std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>,void>
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             local_58.sequencer_,
             (unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
              *)local_58.mesh_);
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::~DepthFirstTraverser
            ((DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              *)local_58.encoding_data_);
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  ::~unique_ptr((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                 *)local_58.encoding_data_);
  return (__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
          )(tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
           _Var1._M_head_impl;
}

Assistant:

std::unique_ptr<PointsSequencer>
MeshEdgebreakerDecoderImpl<TraversalDecoder>::CreateVertexTraversalSequencer(
    MeshAttributeIndicesEncodingData *encoding_data) {
  typedef typename TraverserT::TraversalObserver AttObserver;
  typedef typename TraverserT::CornerTable CornerTable;

  const Mesh *mesh = decoder_->mesh();
  std::unique_ptr<MeshTraversalSequencer<TraverserT>> traversal_sequencer(
      new MeshTraversalSequencer<TraverserT>(mesh, encoding_data));

  AttObserver att_observer(corner_table_.get(), mesh, traversal_sequencer.get(),
                           encoding_data);

  TraverserT att_traverser;
  att_traverser.Init(corner_table_.get(), att_observer);

  traversal_sequencer->SetTraverser(att_traverser);
  return std::move(traversal_sequencer);
}